

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::ParseIdentifier(State *state,size_t length)

{
  bool bVar1;
  char *pcVar2;
  ComplexityGuard local_28;
  ComplexityGuard guard;
  size_t length_local;
  State *state_local;
  
  guard.state_ = (State *)length;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_28,state);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_28);
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    pcVar2 = RemainingInput(state);
    bVar1 = AtLeastNumCharsRemaining(pcVar2,(size_t)guard.state_);
    if (bVar1) {
      bVar1 = IdentifierIsAnonymousNamespace(state,(size_t)guard.state_);
      if (bVar1) {
        MaybeAppend(state,"(anonymous namespace)");
      }
      else {
        pcVar2 = RemainingInput(state);
        MaybeAppendWithLength(state,pcVar2,(size_t)guard.state_);
      }
      (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + (int)guard.state_;
      anon_unknown_3::UpdateHighWaterMark(state);
      state_local._7_1_ = true;
    }
    else {
      state_local._7_1_ = false;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_28);
  return state_local._7_1_;
}

Assistant:

static bool ParseIdentifier(State *state, size_t length) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (!AtLeastNumCharsRemaining(RemainingInput(state), length)) {
    return false;
  }
  if (IdentifierIsAnonymousNamespace(state, length)) {
    MaybeAppend(state, "(anonymous namespace)");
  } else {
    MaybeAppendWithLength(state, RemainingInput(state), length);
  }
  state->parse_state.mangled_idx += length;
  UpdateHighWaterMark(state);
  return true;
}